

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wallet.cpp
# Opt level: O2

bool __thiscall wallet::CWallet::UpgradeWallet(CWallet *this,int version,bilingual_str *error)

{
  bool bVar1;
  char cVar2;
  int iVar3;
  WalletFeature nVersion;
  undefined8 uVar4;
  int *in_R8;
  WalletFeature *args_2;
  long in_FS_OFFSET;
  int prev_version;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock61;
  int local_c4;
  undefined1 local_c0 [24];
  bilingual_str local_a8;
  bilingual_str local_68;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  local_c0._4_4_ = version;
  iVar3 = GetVersion(this);
  local_c0._0_4_ = iVar3;
  if (version == 0) {
    local_68.original._M_dataplus._M_p._0_4_ = 0x297ac;
    WalletLogPrintf<wallet::WalletFeature>
              (this,(ConstevalFormatString<1U>)0x3df8a7,(WalletFeature *)&local_68);
    local_c0._4_4_ = 0x297ac;
  }
  else {
    WalletLogPrintf<int>(this,(ConstevalFormatString<1U>)0x3df8c8,(int *)(local_c0 + 4));
  }
  if ((int)local_c0._4_4_ < iVar3) {
    _(&local_a8,(ConstevalStringLiteral)0x3df8ea);
    tinyformat::format<int,int>
              (&local_68,(tinyformat *)&local_a8,(bilingual_str *)local_c0,(int *)(local_c0 + 4),
               in_R8);
    bilingual_str::operator=(error,&local_68);
    bilingual_str::~bilingual_str(&local_68);
    bilingual_str::~bilingual_str(&local_a8);
    bVar1 = false;
  }
  else {
    args_2 = (WalletFeature *)0x0;
    UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
              ((UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *)(local_c0 + 8),&this->cs_wallet,
               "cs_wallet",
               "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/wallet.cpp"
               ,0xd36,false);
    bVar1 = CanSupportFeature(this,FEATURE_HD_SPLIT);
    if (bVar1 || local_c0._4_4_ - 0x297ac < 0xffff8ad0) {
      nVersion = GetClosestWalletFeature(local_c0._4_4_);
      SetMinVersion(this,nVersion,(WalletBatch *)0x0);
      GetActiveScriptPubKeyMans
                ((set<wallet::ScriptPubKeyMan_*,_std::less<wallet::ScriptPubKeyMan_*>,_std::allocator<wallet::ScriptPubKeyMan_*>_>
                  *)&local_68,this);
      for (uVar4 = local_68.original.field_2._8_8_;
          bVar1 = (size_type *)uVar4 == &local_68.original._M_string_length, !bVar1;
          uVar4 = std::_Rb_tree_increment((_Rb_tree_node_base *)uVar4)) {
        cVar2 = (**(code **)(**(long **)(uVar4 + 0x20) + 0x70))
                          (*(long **)(uVar4 + 0x20),local_c0._0_4_,local_c0._4_4_,error);
        if (cVar2 == '\0') break;
      }
      std::
      _Rb_tree<wallet::ScriptPubKeyMan_*,_wallet::ScriptPubKeyMan_*,_std::_Identity<wallet::ScriptPubKeyMan_*>,_std::less<wallet::ScriptPubKeyMan_*>,_std::allocator<wallet::ScriptPubKeyMan_*>_>
      ::~_Rb_tree((_Rb_tree<wallet::ScriptPubKeyMan_*,_wallet::ScriptPubKeyMan_*,_std::_Identity<wallet::ScriptPubKeyMan_*>,_std::less<wallet::ScriptPubKeyMan_*>,_std::allocator<wallet::ScriptPubKeyMan_*>_>
                   *)&local_68);
    }
    else {
      _(&local_a8,(ConstevalStringLiteral)0x3df93b);
      local_c4 = 0x297ac;
      tinyformat::format<int,int,wallet::WalletFeature>
                (&local_68,(tinyformat *)&local_a8,(bilingual_str *)local_c0,(int *)(local_c0 + 4),
                 &local_c4,args_2);
      bilingual_str::operator=(error,&local_68);
      bilingual_str::~bilingual_str(&local_68);
      bilingual_str::~bilingual_str(&local_a8);
      bVar1 = false;
    }
    std::unique_lock<std::recursive_mutex>::~unique_lock
              ((unique_lock<std::recursive_mutex> *)(local_c0 + 8));
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return bVar1;
  }
  __stack_chk_fail();
}

Assistant:

bool CWallet::UpgradeWallet(int version, bilingual_str& error)
{
    int prev_version = GetVersion();
    if (version == 0) {
        WalletLogPrintf("Performing wallet upgrade to %i\n", FEATURE_LATEST);
        version = FEATURE_LATEST;
    } else {
        WalletLogPrintf("Allowing wallet upgrade up to %i\n", version);
    }
    if (version < prev_version) {
        error = strprintf(_("Cannot downgrade wallet from version %i to version %i. Wallet version unchanged."), prev_version, version);
        return false;
    }

    LOCK(cs_wallet);

    // Do not upgrade versions to any version between HD_SPLIT and FEATURE_PRE_SPLIT_KEYPOOL unless already supporting HD_SPLIT
    if (!CanSupportFeature(FEATURE_HD_SPLIT) && version >= FEATURE_HD_SPLIT && version < FEATURE_PRE_SPLIT_KEYPOOL) {
        error = strprintf(_("Cannot upgrade a non HD split wallet from version %i to version %i without upgrading to support pre-split keypool. Please use version %i or no version specified."), prev_version, version, FEATURE_PRE_SPLIT_KEYPOOL);
        return false;
    }

    // Permanently upgrade to the version
    SetMinVersion(GetClosestWalletFeature(version));

    for (auto spk_man : GetActiveScriptPubKeyMans()) {
        if (!spk_man->Upgrade(prev_version, version, error)) {
            return false;
        }
    }
    return true;
}